

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O3

ProfileId __thiscall
FuncInfo::FindOrAddSlotProfileId(FuncInfo *this,Scope *scope,PropertyId propertyId)

{
  short sVar1;
  ParseableFunctionInfo *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined1 local_38 [8];
  SlotKey key;
  ProfileId profileId;
  
  key._14_2_ = 0xffff;
  local_38 = (undefined1  [8])scope;
  key.scope._0_4_ = propertyId;
  bVar3 = JsUtil::
          BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<FuncInfo::SlotKey>
                    (&this->slotProfileIdMap,(SlotKey *)local_38,(unsigned_short *)&key.field_0xe);
  if (!bVar3) {
    bVar3 = Js::ParseableFunctionInfo::IsFunctionParsed(this->byteCodeFunction);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                         ,0x30b,"(this->byteCodeFunction->IsFunctionParsed())",
                         "this->byteCodeFunction->IsFunctionParsed()");
      if (!bVar3) goto LAB_0081a303;
      *puVar4 = 0;
    }
    this_00 = this->byteCodeFunction;
    bVar3 = Js::FunctionProxy::IsFunctionBody(&this_00->super_FunctionProxy);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar3) {
LAB_0081a303:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    sVar1 = (short)this_00[1].scopeObjectSize;
    if (sVar1 != -1) {
      *(short *)&this_00[1].scopeObjectSize = sVar1 + 1;
      key._14_2_ = sVar1;
      JsUtil::
      BaseDictionary<FuncInfo::SlotKey,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,FuncInfo::SlotKeyComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<FuncInfo::SlotKey,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,FuncInfo::SlotKeyComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<FuncInfo::SlotKey,unsigned_short,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,FuncInfo::SlotKeyComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)&this->slotProfileIdMap,(SlotKey *)local_38,(unsigned_short *)&key.field_0xe);
    }
  }
  return key._14_2_;
}

Assistant:

Js::ProfileId FindOrAddSlotProfileId(Scope* scope, Js::PropertyId propertyId)
    {
        SlotKey key;

        key.scope = scope;
        key.slot = propertyId;
        Js::ProfileId profileId = Js::Constants::NoProfileId;

        if (!this->slotProfileIdMap.TryGetValue(key, &profileId))
        {
            Assert(this->byteCodeFunction->IsFunctionParsed());
            if (this->byteCodeFunction->GetFunctionBody()->AllocProfiledSlotId(&profileId))
            {
                this->slotProfileIdMap.Add(key, profileId);
            }
        }

        return profileId;
    }